

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

bool nivalis::anon_unknown_10::is_var_name_reserved(string *var_name)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)var_name);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)var_name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)var_name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)var_name);
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

bool is_var_name_reserved(const std::string& var_name) {
    return var_name == "x" || var_name == "y" ||
           var_name == "t" || var_name == "r";
}